

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_retcode
settings_SetUserParam
          (CUPDLPsettings *settings,cupdlp_bool *ifChangeIntParam,cupdlp_int *intParam,
          cupdlp_bool *ifChangeFloatParam,cupdlp_float *floatParam)

{
  if (*ifChangeIntParam == true) {
    settings->nIterLim = *intParam;
  }
  if (ifChangeIntParam[8] == true) {
    settings->nLogLevel = intParam[8];
  }
  if (ifChangeIntParam[9] == true) {
    settings->nLogInterval = intParam[9];
  }
  if (ifChangeIntParam[1] == true) {
    settings->ifScaling = intParam[1];
  }
  if (ifChangeIntParam[2] == true) {
    settings->iScalingMethod = intParam[2];
  }
  if (*ifChangeFloatParam == true) {
    settings->dScalingLimit = *floatParam;
  }
  if (ifChangeFloatParam[1] == true) {
    settings->dPrimalTol = floatParam[1];
  }
  if (ifChangeFloatParam[2] == true) {
    settings->dDualTol = floatParam[2];
  }
  if (ifChangeFloatParam[3] == true) {
    settings->dGapTol = floatParam[3];
  }
  if (ifChangeFloatParam[5] == true) {
    settings->dTimeLim = floatParam[5];
  }
  if (ifChangeIntParam[4] == true) {
    settings->eRestartMethod = intParam[4];
  }
  if (ifChangeIntParam[0xb] == true) {
    settings->iInfNormAbsLocalTermination = intParam[0xb];
  }
  return 0;
}

Assistant:

cupdlp_retcode settings_SetUserParam(CUPDLPsettings *settings,
                                     cupdlp_bool *ifChangeIntParam,
                                     cupdlp_int *intParam,
                                     cupdlp_bool *ifChangeFloatParam,
                                     cupdlp_float *floatParam) {
  cupdlp_retcode retcode = RETCODE_OK;

  if (ifChangeIntParam[N_ITER_LIM]) {
    settings->nIterLim = intParam[N_ITER_LIM];
  }

  if (ifChangeIntParam[N_LOG_LEVEL]) {
    settings->nLogLevel = intParam[N_LOG_LEVEL];
  }

  if (ifChangeIntParam[N_LOG_INTERVAL]) {
    settings->nLogInterval = intParam[N_LOG_INTERVAL];
  }

  if (ifChangeIntParam[IF_SCALING]) {
    settings->ifScaling = intParam[IF_SCALING];
  }

  if (ifChangeIntParam[I_SCALING_METHOD]) {
    settings->iScalingMethod = intParam[I_SCALING_METHOD];
  }

  if (ifChangeFloatParam[D_SCALING_LIMIT]) {
    settings->dScalingLimit = floatParam[D_SCALING_LIMIT];
  }

  if (ifChangeFloatParam[D_PRIMAL_TOL]) {
    settings->dPrimalTol = floatParam[D_PRIMAL_TOL];
  }

  if (ifChangeFloatParam[D_DUAL_TOL]) {
    settings->dDualTol = floatParam[D_DUAL_TOL];
  }

  if (ifChangeFloatParam[D_GAP_TOL]) {
    settings->dGapTol = floatParam[D_GAP_TOL];
  }

  if (ifChangeFloatParam[D_TIME_LIM]) {
    settings->dTimeLim = floatParam[D_TIME_LIM];
  }

  if (ifChangeIntParam[E_RESTART_METHOD]) {
    settings->eRestartMethod = intParam[E_RESTART_METHOD];
  }

  if (ifChangeIntParam[I_INF_NORM_ABS_LOCAL_TERMINATION]) {
    settings->iInfNormAbsLocalTermination = intParam[I_INF_NORM_ABS_LOCAL_TERMINATION];
  }

exit_cleanup:
  return retcode;
}